

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O3

double __thiscall
sector_t::NextHighestCeilingAt
          (sector_t *this,double x,double y,double bottomz,double topz,int flags,
          sector_t **resultsec,F3DFloor **resultffloor)

{
  F3DFloor *pFVar1;
  secplane_t *psVar2;
  bool bVar3;
  sector_t *psVar4;
  subsector_t *psVar5;
  sector_t *psVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  psVar4 = this;
  dVar13 = -3.4028234663852886e+38;
  while( true ) {
    dVar11 = (y * (psVar4->ceilingplane).normal.Y +
             (psVar4->ceilingplane).normal.X * x + (psVar4->ceilingplane).D) *
             (psVar4->ceilingplane).negiC;
    uVar7 = (psVar4->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count - 1;
    if (-1 < (int)uVar7) {
      lVar8 = (ulong)uVar7 + 1;
      do {
        pFVar1 = (psVar4->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[lVar8 + -1];
        if ((~pFVar1->flags & 3) == 0) {
          psVar2 = (pFVar1->bottom).plane;
          dVar10 = ((psVar2->normal).Y * y + psVar2->D + (psVar2->normal).X * x) * psVar2->negiC;
          if ((dVar10 < dVar11) &&
             (psVar2 = (pFVar1->top).plane,
             dVar12 = (((psVar2->normal).Y * y + psVar2->D + (psVar2->normal).X * x) * psVar2->negiC
                      - dVar10) * 0.5 + dVar10, ABS(topz - dVar12) < ABS(bottomz - dVar12))) {
            if (resultsec != (sector_t **)0x0) {
              *resultsec = psVar4;
            }
            if (resultffloor == (F3DFloor **)0x0) {
              return dVar10;
            }
            *resultffloor = pFVar1;
            return dVar10;
          }
        }
        lVar9 = lVar8 + -1;
        bVar3 = 0 < lVar8;
        lVar8 = lVar9;
      } while (lVar9 != 0 && bVar3);
    }
    psVar6 = this;
    if (((flags & 0x10U) != 0) || (psVar6 = psVar4, (psVar4->planes[1].Flags & 0x1d0U) != 0x100))
    break;
    dVar10 = sectorPortals.Array[psVar4->Portals[1]].mPlaneZ;
    if (dVar10 <= dVar13) break;
    x = x + sectorPortals.Array[psVar4->Portals[1]].mDisplacement.X;
    y = y + sectorPortals.Array[psVar4->Portals[1]].mDisplacement.Y;
    psVar5 = P_PointInSubsector(x,y);
    psVar4 = psVar5->sector;
    dVar13 = dVar10;
  }
  if (resultffloor != (F3DFloor **)0x0) {
    *resultffloor = (F3DFloor *)0x0;
  }
  if (resultsec != (sector_t **)0x0) {
    *resultsec = psVar6;
  }
  return dVar11;
}

Assistant:

double sector_t::NextHighestCeilingAt(double x, double y, double bottomz, double topz, int flags, sector_t **resultsec, F3DFloor **resultffloor)
{
	sector_t *sec = this;
	double planeheight = -FLT_MAX;

	while (true)
	{
		// Looking through planes from bottom to top
		double realceil = sec->ceilingplane.ZatPoint(x, y);
		for (int i = sec->e->XFloor.ffloors.Size() - 1; i >= 0; --i)
		{
			F3DFloor *rover = sec->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double ff_bottom = rover->bottom.plane->ZatPoint(x, y);
			double ff_top = rover->top.plane->ZatPoint(x, y);

			double delta1 = bottomz - (ff_bottom + ((ff_top - ff_bottom) / 2));
			double delta2 = topz - (ff_bottom + ((ff_top - ff_bottom) / 2));

			if (ff_bottom < realceil && fabs(delta1) > fabs(delta2))
			{ 
				if (resultsec) *resultsec = sec;
				if (resultffloor) *resultffloor = rover;
				return ff_bottom;
			}
		}
		if ((flags & FFCF_NOPORTALS) || sec->PortalBlocksMovement(ceiling) || planeheight >= sec->GetPortalPlaneZ(ceiling))
		{ // Use sector's floor
			if (resultffloor) *resultffloor = NULL;
			if (resultsec) *resultsec = sec;
			return realceil;
		}
		else
		{
			DVector2 pos = sec->GetPortalDisplacement(ceiling);
			x += pos.X;
			y += pos.Y;
			planeheight = sec->GetPortalPlaneZ(ceiling);
			sec = P_PointInSector(x, y);
		}
	}
}